

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFuncType
          (BinaryReaderInterp *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  ModuleDesc *this_00;
  bool bVar1;
  ValueTypes local_b0;
  ValueTypes local_98;
  FuncType local_80;
  Enum local_3c;
  Type *local_38;
  Type *result_types_local;
  Type *pTStack_28;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_38 = result_types;
  result_types_local._4_4_ = result_count;
  pTStack_28 = param_types;
  param_types_local._0_4_ = param_count;
  param_types_local._4_4_ = index;
  _param_count_local = this;
  local_3c = (Enum)SharedValidator::OnFuncType
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,param_count
                              ,param_types,result_count,result_types);
  bVar1 = Failed((Result)local_3c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->module_;
    ToInterp(&local_98,(Index)param_types_local,pTStack_28);
    ToInterp(&local_b0,result_types_local._4_4_,local_38);
    FuncType::FuncType(&local_80,&local_98,&local_b0);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this_00->func_types,&local_80);
    FuncType::~FuncType(&local_80);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_b0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_98);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnFuncType(Index index,
                                      Index param_count,
                                      Type* param_types,
                                      Index result_count,
                                      Type* result_types) {
  CHECK_RESULT(validator_.OnFuncType(loc, param_count, param_types,
                                     result_count, result_types));
  module_.func_types.push_back(FuncType(ToInterp(param_count, param_types),
                                        ToInterp(result_count, result_types)));
  return Result::Ok;
}